

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprListSetSpan(Parse *pParse,ExprList *pList,char *zStart,char *zEnd)

{
  sqlite3 *db;
  char *pcVar1;
  char **ppcVar2;
  
  if (pList != (ExprList *)0x0) {
    db = pParse->db;
    ppcVar2 = &pList->a[(long)pList->nExpr + -1].zSpan;
    pcVar1 = *ppcVar2;
    if (pcVar1 != (char *)0x0) {
      sqlite3DbFreeNN(db,pcVar1);
    }
    pcVar1 = sqlite3DbSpanDup(db,zStart,zEnd);
    *ppcVar2 = pcVar1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetSpan(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  const char *zStart,     /* Start of the span */
  const char *zEnd        /* End of the span */
){
  sqlite3 *db = pParse->db;
  assert( pList!=0 || db->mallocFailed!=0 );
  if( pList ){
    struct ExprList_item *pItem = &pList->a[pList->nExpr-1];
    assert( pList->nExpr>0 );
    sqlite3DbFree(db, pItem->zSpan);
    pItem->zSpan = sqlite3DbSpanDup(db, zStart, zEnd);
  }
}